

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void FM_KEYOFF(OPL3_SLOT *SLOT,UINT32 key_clr)

{
  UINT32 key_clr_local;
  OPL3_SLOT *SLOT_local;
  
  if (((SLOT->key != 0) && (SLOT->key = key_clr & SLOT->key, SLOT->key == 0)) && (1 < SLOT->state))
  {
    SLOT->state = '\x01';
  }
  return;
}

Assistant:

INLINE void FM_KEYOFF(FM_OPN2 *OPN, FM_CH *CH , int s )
{
	FM_SLOT *SLOT = &CH->SLOT[s];

	if (SLOT->key && (!OPN->SL3.key_csm || CH == &OPN->P_CH[3]))
	{
		if (SLOT->state>EG_REL)
		{
			SLOT->state = EG_REL; /* phase -> Release */

			/* SSG-EG specific update */
			if (SLOT->ssg&0x08)
			{
				/* convert EG attenuation level */
				if (SLOT->ssgn ^ (SLOT->ssg&0x04))
					SLOT->volume = (0x200 - SLOT->volume);

				/* force EG attenuation level */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state  = EG_OFF;
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
		}
		if (OPN->LegacyMode)	// workaround for VGMs trimmed with VGMTool
			refresh_fc_eg_slot(OPN, SLOT, CH->fc, CH->kcode);
	}

	SLOT->key = 0;
}